

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void DLevelScript::SetLineTexture(int lineid,int side,int position,int name)

{
  FTextureID FVar1;
  uint uVar2;
  char *name_00;
  FLineIdIterator itr;
  
  name_00 = FBehavior::StaticLookupString(name);
  if (name_00 != (char *)0x0) {
    FVar1 = FTextureManager::GetTexture(&TexMan,name_00,1,2);
    itr.start = tagManager.IDHashFirst[lineid & 0xff];
    itr.searchtag = lineid;
    while( true ) {
      uVar2 = FLineIdIterator::Next(&itr);
      if ((int)uVar2 < 0) break;
      if (lines[uVar2].sidedef[side != 0] != (side_t *)0x0 && (uint)position < 3) {
        lines[uVar2].sidedef[side != 0]->textures[(uint)position].texture.texnum = FVar1.texnum;
      }
    }
  }
  return;
}

Assistant:

void DLevelScript::SetLineTexture (int lineid, int side, int position, int name)
{
	FTextureID texture;
	int linenum = -1;
	const char *texname = FBehavior::StaticLookupString (name);

	if (texname == NULL)
		return;

	side = !!side;

	texture = TexMan.GetTexture (texname, FTexture::TEX_Wall, FTextureManager::TEXMAN_Overridable);

	FLineIdIterator itr(lineid);
	while ((linenum = itr.Next()) >= 0)
	{
		side_t *sidedef;

		sidedef = lines[linenum].sidedef[side];
		if (sidedef == NULL)
			continue;

		switch (position)
		{
		case TEXTURE_TOP:
			sidedef->SetTexture(side_t::top, texture);
			break;
		case TEXTURE_MIDDLE:
			sidedef->SetTexture(side_t::mid, texture);
			break;
		case TEXTURE_BOTTOM:
			sidedef->SetTexture(side_t::bottom, texture);
			break;
		default:
			break;
		}

	}
}